

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O0

void __thiscall
Fl_Graphics_Driver::mult_matrix
          (Fl_Graphics_Driver *this,double a,double b,double c,double d,double x,double y)

{
  double local_70;
  matrix o;
  double y_local;
  double x_local;
  double d_local;
  double c_local;
  double b_local;
  double a_local;
  Fl_Graphics_Driver *this_local;
  
  local_70 = a * (this->m).a + b * (this->m).c;
  o.a = a * (this->m).b + b * (this->m).d;
  o.b = c * (this->m).a + d * (this->m).c;
  o.c = c * (this->m).b + d * (this->m).d;
  o.d = x * (this->m).a + y * (this->m).c + (this->m).x;
  o.x = x * (this->m).b + y * (this->m).d + (this->m).y;
  o.y = y;
  memcpy(&this->m,&local_70,0x30);
  return;
}

Assistant:

void Fl_Graphics_Driver::mult_matrix(double a, double b, double c, double d, double x, double y) {
  matrix o;
  o.a = a*m.a + b*m.c;
  o.b = a*m.b + b*m.d;
  o.c = c*m.a + d*m.c;
  o.d = c*m.b + d*m.d;
  o.x = x*m.a + y*m.c + m.x;
  o.y = x*m.b + y*m.d + m.y;
  m = o;
}